

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:583:55)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:583:55)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  gc_heap *h;
  uint32_t uVar1;
  uint uVar2;
  value *pvVar3;
  gc_heap_ptr_untyped *this_00;
  undefined8 *puVar4;
  long *plVar5;
  uint32_t index;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX_00;
  uint uVar7;
  wstring i2;
  wstring i1;
  value v1;
  value v2;
  wstring_view local_100;
  undefined1 local_f0 [16];
  value *local_e0;
  value *local_d8;
  wstring local_d0;
  wstring local_b0;
  value local_90;
  value local_68;
  
  local_d8 = __return_storage_ptr__;
  pvVar3 = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->f);
  global_object::validate_object((global_object *)&stack0xffffffffffffffc0,pvVar3);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffc0);
  local_e0 = this_;
  this_00 = &value::object_value(this_)->super_gc_heap_ptr_untyped;
  puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(this_00);
  local_68._0_8_ = 6;
  local_68.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x18f5a4;
  (**(code **)*puVar4)(&local_90,puVar4);
  uVar1 = to_uint32(&local_90);
  value::~value(&local_90);
  h = (this->f).global.super_gc_heap_ptr_untyped.heap_;
  uVar2 = uVar1 >> 1;
  uVar6 = extraout_RDX;
  for (uVar7 = 0; pvVar3 = local_d8, uVar1 = uVar1 - 1, uVar2 != uVar7; uVar7 = uVar7 + 1) {
    index_string_abi_cxx11_(&local_b0,(mjs *)(ulong)uVar7,(uint32_t)uVar6);
    index_string_abi_cxx11_(&local_d0,(mjs *)(ulong)uVar1,index);
    puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(this_00);
    local_68._0_8_ = local_b0._M_string_length;
    local_68.field_1.n_ = (double)local_b0._M_dataplus._M_p;
    (**(code **)*puVar4)(&local_90,puVar4,&local_68);
    puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(this_00);
    local_f0._0_8_ = local_d0._M_string_length;
    local_f0._8_8_ = local_d0._M_dataplus._M_p;
    (**(code **)*puVar4)(&local_68,puVar4,(gc_heap_ptr_untyped *)local_f0);
    plVar5 = (long *)gc_heap_ptr_untyped::get(this_00);
    local_100._M_len = local_b0._M_string_length;
    local_100._M_str = local_b0._M_dataplus._M_p;
    string::string((string *)local_f0,h,&local_100);
    (**(code **)(*plVar5 + 8))(plVar5,(gc_heap_ptr_untyped *)local_f0,&local_68,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    plVar5 = (long *)gc_heap_ptr_untyped::get(this_00);
    local_100._M_len = local_d0._M_string_length;
    local_100._M_str = local_d0._M_dataplus._M_p;
    string::string((string *)local_f0,h,&local_100);
    (**(code **)(*plVar5 + 8))(plVar5,(gc_heap_ptr_untyped *)local_f0,&local_90,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_f0);
    value::~value(&local_68);
    value::~value(&local_90);
    std::__cxx11::wstring::~wstring((wstring *)&local_d0);
    std::__cxx11::wstring::~wstring((wstring *)&local_b0);
    uVar6 = extraout_RDX_00;
  }
  value::value(local_d8,local_e0);
  return pvVar3;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }